

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O0

void absl::lts_20250127::cord_internal::anon_unknown_0::
     AnalyzeDataEdge<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2>
               (CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2> rep,
               RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2>
               *raw_usage)

{
  bool bVar1;
  CordRepSubstring *pCVar2;
  CordRepFlat *this;
  size_t local_40;
  size_t size;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2> *raw_usage_local;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2> rep_local;
  
  raw_usage_local =
       (RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2> *)rep.rep;
  bVar1 = IsDataEdge(rep.rep);
  if (!bVar1) {
    __assert_fail("IsDataEdge(rep.rep)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord_analysis.cc"
                  ,0x78,
                  "void absl::cord_internal::(anonymous namespace)::AnalyzeDataEdge(CordRepRef<mode>, RawUsage<mode> &) [mode = absl::cord_internal::(anonymous namespace)::Mode::kTotalMorePrecise]"
                 );
  }
  if (*(char *)((long)&(raw_usage_local->counted)._M_h._M_buckets + 4) == '\x01') {
    RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2>::Add
              (raw_usage,0x20,
               (CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2>)
               raw_usage_local);
    pCVar2 = CordRep::substring((CordRep *)raw_usage_local);
    raw_usage_local =
         (RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2> *)
         CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2>::Child
                   ((CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2> *
                    )&raw_usage_local,pCVar2->child);
  }
  if (*(byte *)((long)&(raw_usage_local->counted)._M_h._M_buckets + 4) < 6) {
    local_40 = raw_usage_local->total + 0x28;
  }
  else {
    this = CordRep::flat((CordRep *)raw_usage_local);
    local_40 = CordRepFlat::AllocatedSize(this);
  }
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2>::Add
            (raw_usage,local_40,
             (CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2>)
             raw_usage_local);
  return;
}

Assistant:

void AnalyzeDataEdge(CordRepRef<mode> rep, RawUsage<mode>& raw_usage) {
  assert(IsDataEdge(rep.rep));

  // Consume all substrings
  if (rep.rep->tag == SUBSTRING) {
    raw_usage.Add(sizeof(CordRepSubstring), rep);
    rep = rep.Child(rep.rep->substring()->child);
  }

  // Consume FLAT / EXTERNAL
  const size_t size =
      rep.rep->tag >= FLAT
          ? rep.rep->flat()->AllocatedSize()
          : rep.rep->length + sizeof(CordRepExternalImpl<intptr_t>);
  raw_usage.Add(size, rep);
}